

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int expand_fast_array(JSContext *ctx,JSObject *p,uint32_t new_len)

{
  int iVar1;
  size_t in_RAX;
  JSVarRef **ppJVar2;
  uint uVar3;
  ulong uVar4;
  size_t slack;
  
  uVar3 = (uint)(*(int *)&p->u * 3) >> 1;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < (int)new_len) {
    uVar4 = (ulong)new_len;
  }
  slack = in_RAX;
  ppJVar2 = (JSVarRef **)js_realloc2(ctx,(p->u).func.var_refs,uVar4 << 4,&slack);
  if (ppJVar2 == (JSVarRef **)0x0) {
    iVar1 = -1;
  }
  else {
    (p->u).func.var_refs = ppJVar2;
    *(int *)&p->u = (int)uVar4 + (int)(slack >> 4);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int expand_fast_array(JSContext *ctx, JSObject *p, uint32_t new_len)
{
    uint32_t new_size;
    size_t slack;
    JSValue *new_array_prop;
    /* XXX: potential arithmetic overflow */
    new_size = max_int(new_len, p->u.array.u1.size * 3 / 2);
    new_array_prop = js_realloc2(ctx, p->u.array.u.values, sizeof(JSValue) * new_size, &slack);
    if (!new_array_prop)
        return -1;
    new_size += slack / sizeof(*new_array_prop);
    p->u.array.u.values = new_array_prop;
    p->u.array.u1.size = new_size;
    return 0;
}